

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::PopTarget(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  SQLocalVarInfo *pSVar2;
  long lVar3;
  SQUnsignedInteger SVar4;
  
  pSVar2 = (this->_vlocals)._vals;
  lVar3 = (this->_targetstack)._vals[(this->_targetstack)._size - 1];
  if (pSVar2[lVar3]._name.super_SQObject._type == OT_NULL) {
    SVar4 = (this->_vlocals)._size - 1;
    (this->_vlocals)._size = SVar4;
    SQObjectPtr::~SQObjectPtr(&pSVar2[SVar4]._name);
  }
  pSVar1 = &(this->_targetstack)._size;
  *pSVar1 = *pSVar1 - 1;
  return lVar3;
}

Assistant:

SQInteger SQFuncState::PopTarget()
{
    SQUnsignedInteger npos=_targetstack.back();
    assert(npos < _vlocals.size());
    SQLocalVarInfo &t = _vlocals[npos];
    if(sq_type(t._name)==OT_NULL){
        _vlocals.pop_back();
    }
    _targetstack.pop_back();
    return npos;
}